

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O2

JsonArrayWriter * __thiscall
Catch::JsonArrayWriter::writeImpl<bool>(JsonArrayWriter *this,bool *value)

{
  size_t in_RCX;
  void *__buf;
  JsonValueWriter local_1b0;
  
  JsonUtils::appendCommaNewline(this->m_os,&this->m_should_comma,this->m_indent_level + 1);
  JsonValueWriter::JsonValueWriter(&local_1b0,this->m_os);
  JsonValueWriter::write(&local_1b0,(uint)*value,__buf,in_RCX);
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b0.m_sstream);
  return this;
}

Assistant:

JsonArrayWriter& writeImpl( T const& value ) {
            JsonUtils::appendCommaNewline(
                m_os, m_should_comma, m_indent_level + 1 );
            JsonValueWriter{ m_os }.write( value );

            return *this;
        }